

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O3

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_EqNull_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_EqNull_Test<wchar_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wchar_t **in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f1;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  local_198._0_8_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x0;
  iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_1f0,(StrCaseEqHelper *)"__null","p",local_198,(wchar_t **)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x97;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  paVar1 = &local_1f0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x0;
  iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_1f0,(StrCaseEqHelper *)"__null","p",local_198,(wchar_t **)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x98;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  local_198._0_8_ = 0;
  local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x0;
  iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_1f0,(StrCaseEqHelper *)"__null","p",local_198,(wchar_t **)&local_1c8,in_R9);
  if (local_1f0.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x99;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, EqNull)
{
    TypeParam* p=NULL;
    IUTEST_INFORM_STRCASEEQ(NULL, p);
    IUTEST_EXPECT_STRCASEEQ(NULL, p);
    IUTEST_ASSERT_STRCASEEQ(NULL, p);
}